

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O1

void __thiscall
directed_flag_complex_computer::store_coboundaries_in_cache_t::done
          (store_coboundaries_in_cache_t *this)

{
  ostream *poVar1;
  
  if (this->is_first == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dimension ",10);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,this->current_dimension);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,": computed almost all of the coboundaries",0x29);
    poVar1 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\r",1);
    return;
  }
  return;
}

Assistant:

void done() {
#ifdef INDICATE_PROGRESS
		if (is_first)
			std::cout << "\033[K"
			          << "dimension " << current_dimension << ": computed almost all of the coboundaries" << std::flush
			          << "\r";
#endif
	}